

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  char *pcVar2;
  Ch *pCVar3;
  Ch *pCVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar9;
  byte *pbVar10;
  ulong uVar11;
  byte bVar12;
  uint16_t uVar13;
  undefined4 uVar14;
  ulong uVar15;
  byte bVar16;
  long lVar17;
  uint uVar18;
  SizeType SVar19;
  byte *pbVar20;
  int iVar21;
  uint uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  
  bVar12 = *is->src_;
  if (bVar12 < 0x6e) {
    if (bVar12 == 0x22) {
      ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar12 != 0x5b) {
      if (bVar12 != 0x66) {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pcVar2 = is->src_;
      if (*pcVar2 != 'f') {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x373,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      is->src_ = pcVar2 + 1;
      if ((((pcVar2[1] == 'a') && (is->src_ = pcVar2 + 2, pcVar2[2] == 'l')) &&
          (is->src_ = pcVar2 + 3, pcVar2[3] == 's')) && (is->src_ = pcVar2 + 4, pcVar2[4] == 'e')) {
        is->src_ = pcVar2 + 5;
        pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        (pGVar9->data_).n = (Number)0x0;
        (pGVar9->data_).s.str = (Ch *)0x0;
        (pGVar9->data_).f.flags = 9;
      }
      else {
        ParseFalse<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
      }
      return;
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x329,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                       (&handler->stack_,1);
    (pGVar9->data_).n = (Number)0x0;
    (pGVar9->data_).s.str = (Ch *)0x0;
    (pGVar9->data_).f.flags = 4;
    pbVar10 = (byte *)is->src_;
    while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))) {
      pbVar10 = pbVar10 + 1;
    }
    is->src_ = (Ch *)pbVar10;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar10 == 0x5d) {
        is->src_ = (Ch *)(pbVar10 + 1);
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndArray(handler,0);
        if (!bVar7) {
          ParseArray<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this + 0x30);
LAB_0010fb66:
          uVar14 = 0x10;
LAB_0010fb6b:
          pCVar3 = is->src_;
          pCVar4 = is->head_;
          *(undefined4 *)(this + 0x30) = uVar14;
          *(long *)(this + 0x38) = (long)pCVar3 - (long)pCVar4;
        }
      }
      else {
        ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) == 0) {
          SVar19 = 0;
          do {
            pbVar10 = (byte *)is->src_;
            while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))
                  ) {
              pbVar10 = pbVar10 + 1;
            }
            SVar19 = SVar19 + 1;
            is->src_ = (Ch *)pbVar10;
            if (*pbVar10 != 0x2c) {
              if (*is->src_ != ']') {
                uVar14 = 7;
                goto LAB_0010fb6b;
              }
              is->src_ = is->src_ + 1;
              bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      ::EndArray(handler,SVar19);
              if (bVar7) {
                return;
              }
              ParseArray<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                        (this + 0x30);
              goto LAB_0010fb66;
            }
            pbVar10 = pbVar10 + 1;
            is->src_ = (Ch *)pbVar10;
            while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))
                  ) {
              pbVar10 = pbVar10 + 1;
            }
            is->src_ = (Ch *)pbVar10;
            ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
          } while (*(int *)(this + 0x30) == 0);
        }
      }
    }
    return;
  }
  if (bVar12 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x2e5,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                       (&handler->stack_,1);
    (pGVar9->data_).n = (Number)0x0;
    (pGVar9->data_).s.str = (Ch *)0x0;
    (pGVar9->data_).f.flags = 3;
    pbVar10 = (byte *)is->src_;
    while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))) {
      pbVar10 = pbVar10 + 1;
    }
    is->src_ = (Ch *)pbVar10;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar10 == 0x7d) {
        is->src_ = (Ch *)(pbVar10 + 1);
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndObject(handler,0);
        if (bVar7) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x2f0,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_0010f9b4:
        pbVar10 = (byte *)is->src_;
        uVar14 = 0x10;
      }
      else {
        pbVar10 = (byte *)is->src_;
        if (*pbVar10 == 0x22) {
          SVar19 = 0;
          do {
            ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler,true);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar10 = (byte *)is->src_;
            while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))
                  ) {
              pbVar10 = pbVar10 + 1;
            }
            is->src_ = (Ch *)pbVar10;
            if (*pbVar10 != 0x3a) {
              pbVar10 = (byte *)is->src_;
              uVar14 = 5;
              goto LAB_0010fa05;
            }
            pbVar10 = pbVar10 + 1;
            is->src_ = (Ch *)pbVar10;
            while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))
                  ) {
              pbVar10 = pbVar10 + 1;
            }
            is->src_ = (Ch *)pbVar10;
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar10 = (byte *)is->src_;
            while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))
                  ) {
              pbVar10 = pbVar10 + 1;
            }
            is->src_ = (Ch *)pbVar10;
            SVar19 = SVar19 + 1;
            if (*pbVar10 != 0x2c) {
              if (*pbVar10 != 0x7d) {
                uVar14 = 6;
                goto LAB_0010fa05;
              }
              is->src_ = (Ch *)(pbVar10 + 1);
              bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      ::EndObject(handler,SVar19);
              if (bVar7) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                              ,0x315,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_0010f9b4;
            }
            pbVar10 = pbVar10 + 1;
            is->src_ = (Ch *)pbVar10;
            while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))
                  ) {
              pbVar10 = pbVar10 + 1;
            }
            is->src_ = (Ch *)pbVar10;
          } while (*pbVar10 == 0x22);
        }
        uVar14 = 4;
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x2f6,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
LAB_0010fa05:
      pCVar3 = is->head_;
      *(undefined4 *)(this + 0x30) = uVar14;
      *(long *)(this + 0x38) = (long)pbVar10 - (long)pCVar3;
    }
    return;
  }
  if (bVar12 == 0x74) {
    pcVar2 = is->src_;
    if (*pcVar2 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x366,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = pcVar2 + 1;
    if (((pcVar2[1] == 'r') && (is->src_ = pcVar2 + 2, pcVar2[2] == 'u')) &&
       (is->src_ = pcVar2 + 3, pcVar2[3] == 'e')) {
      is->src_ = pcVar2 + 4;
      pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         (&handler->stack_,1);
      (pGVar9->data_).n = (Number)0x0;
      (pGVar9->data_).s.str = (Ch *)0x0;
      (pGVar9->data_).f.flags = 10;
    }
    else {
      ParseTrue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
    }
    return;
  }
  if (bVar12 == 0x6e) {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pcVar2 = is->src_;
  pCVar3 = is->head_;
  cVar1 = *pcVar2;
  pbVar10 = (byte *)(pcVar2 + (cVar1 == '-'));
  bVar12 = pcVar2[cVar1 == '-'];
  if (bVar12 == 0x30) {
    pbVar20 = pbVar10 + 1;
    bVar7 = false;
    iVar8 = 0;
    uVar18 = 0;
    uVar22 = 0;
    goto LAB_0010fcd2;
  }
  if ((byte)(bVar12 - 0x31) < 9) {
    uVar22 = bVar12 - 0x30;
    bVar12 = pbVar10[1];
    pbVar20 = pbVar10 + 1;
    if (cVar1 == '-') {
      if ((byte)(bVar12 - 0x30) < 10) {
        iVar8 = 0;
        do {
          if ((0xccccccb < uVar22) && ('8' < (char)bVar12 || uVar22 != 0xccccccc))
          goto LAB_0010fcc8;
          uVar22 = ((uint)bVar12 + uVar22 * 10) - 0x30;
          iVar8 = iVar8 + 1;
          bVar12 = pbVar20[1];
          pbVar20 = pbVar20 + 1;
        } while ((byte)(bVar12 - 0x30) < 10);
      }
      else {
LAB_001103ea:
        iVar8 = 0;
      }
    }
    else {
      if (9 < (byte)(bVar12 - 0x30)) goto LAB_001103ea;
      iVar8 = 0;
      do {
        if ((0x19999998 < uVar22) && ('5' < (char)bVar12 || uVar22 != 0x19999999))
        goto LAB_0010fcc8;
        uVar22 = ((uint)bVar12 + uVar22 * 10) - 0x30;
        iVar8 = iVar8 + 1;
        bVar12 = pbVar20[1];
        pbVar20 = pbVar20 + 1;
      } while ((byte)(bVar12 - 0x30) < 10);
    }
    bVar7 = false;
    uVar18 = 0;
    goto LAB_0010fcd2;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                  ,0x60c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar17 = (long)pbVar10 - (long)pCVar3;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_001103fc;
LAB_0010fcc8:
  bVar7 = true;
  uVar18 = uVar22;
LAB_0010fcd2:
  uVar11 = (ulong)uVar18;
  dVar27 = 0.0;
  if (bVar7) {
    bVar12 = *pbVar20;
    bVar16 = bVar12 - 0x30;
    if (cVar1 == '-') {
      while (bVar16 < 10) {
        if ((0xccccccccccccccb < uVar11) && (uVar11 != 0xccccccccccccccc || '8' < (char)bVar12))
        goto LAB_0010fdd5;
        uVar11 = (ulong)(bVar12 & 0xf) + uVar11 * 10;
        iVar8 = iVar8 + 1;
        bVar12 = pbVar20[1];
        pbVar20 = pbVar20 + 1;
        bVar16 = bVar12 - 0x30;
      }
    }
    else {
      while (bVar16 < 10) {
        if ((0x1999999999999998 < uVar11) && (uVar11 != 0x1999999999999999 || '5' < (char)bVar12))
        goto LAB_0010fdd5;
        uVar11 = (ulong)(bVar12 & 0xf) + uVar11 * 10;
        iVar8 = iVar8 + 1;
        bVar12 = pbVar20[1];
        pbVar20 = pbVar20 + 1;
        bVar16 = bVar12 - 0x30;
      }
    }
  }
  bVar5 = false;
  goto LAB_0010fdfd;
LAB_0010fdd5:
  auVar24._8_4_ = (int)(uVar11 >> 0x20);
  auVar24._0_8_ = uVar11;
  auVar24._12_4_ = 0x45300000;
  dVar27 = (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
  bVar5 = true;
LAB_0010fdfd:
  if (bVar5) {
    bVar12 = *pbVar20;
    while ((byte)(bVar12 - 0x30) < 10) {
      dVar27 = dVar27 * 10.0 + (double)(int)(bVar12 - 0x30);
      pbVar10 = pbVar20 + 1;
      pbVar20 = pbVar20 + 1;
      bVar12 = *pbVar10;
    }
  }
  pbVar10 = pbVar20 + (*pbVar20 == 0x2e);
  iVar21 = 0;
  uVar15 = uVar11;
  if (*pbVar20 == 0x2e) {
    if (0xf5 < (byte)(*pbVar10 - 0x3a)) {
      iVar21 = 0;
      if (!bVar5) {
        uVar15 = (ulong)uVar22;
        if (bVar7) {
          uVar15 = uVar11;
        }
        bVar12 = *pbVar10;
        iVar21 = 0;
        if ((0xf5 < (byte)(bVar12 - 0x3a)) && (iVar21 = 0, uVar15 < 0x20000000000000)) {
          lVar17 = 0;
          do {
            uVar15 = ((ulong)bVar12 & 0xf) + uVar15 * 10;
            iVar8 = (uint)(uVar15 != 0) + iVar8;
            bVar12 = pbVar10[lVar17 + 1];
            lVar17 = lVar17 + 1;
            if ((byte)(bVar12 - 0x3a) < 0xf6) break;
          } while (uVar15 < 0x20000000000000);
          iVar21 = -(int)lVar17;
          pbVar10 = pbVar10 + lVar17;
        }
        auVar25._8_4_ = (int)(uVar15 >> 0x20);
        auVar25._0_8_ = uVar15;
        auVar25._12_4_ = 0x45300000;
        dVar27 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
        bVar5 = true;
      }
      bVar12 = *pbVar10;
      while ((byte)(bVar12 - 0x30) < 10) {
        if (iVar8 < 0x11) {
          dVar27 = dVar27 * 10.0 + (double)(int)(bVar12 - 0x30);
          iVar21 = iVar21 + -1;
          if (0.0 < dVar27) {
            iVar8 = iVar8 + 1;
          }
        }
        pbVar20 = pbVar10 + 1;
        pbVar10 = pbVar10 + 1;
        bVar12 = *pbVar20;
      }
      goto LAB_0010ff7a;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x637,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar17 = (long)pbVar10 - (long)pCVar3;
    *(undefined4 *)(this + 0x30) = 0xe;
  }
  else {
LAB_0010ff7a:
    lVar17 = (long)pcVar2 - (long)pCVar3;
    bVar12 = *pbVar10;
    pbVar10 = pbVar10 + (bVar12 == 0x65);
    if (bVar12 == 0x65) {
LAB_0010ffb7:
      uVar11 = (ulong)uVar22;
      if (bVar7) {
        uVar11 = uVar15;
      }
      if (!bVar5) {
        auVar26._8_4_ = (int)(uVar11 >> 0x20);
        auVar26._0_8_ = uVar11;
        auVar26._12_4_ = 0x45300000;
        dVar27 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
        bVar5 = true;
      }
      bVar12 = *pbVar10;
      pbVar10 = pbVar10 + (bVar12 == 0x2b);
      bVar23 = false;
      if (bVar12 != 0x2b) {
        bVar23 = *pbVar10 == 0x2d;
        pbVar10 = pbVar10 + bVar23;
      }
      bVar12 = *pbVar10;
      if ((byte)(bVar12 - 0x30) < 10) {
        pbVar10 = pbVar10 + 1;
        iVar8 = bVar12 - 0x30;
        if (bVar23) {
          if (0 < iVar21) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                          ,0x677,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          bVar12 = *pbVar10;
          if ((byte)(bVar12 - 0x30) < 10) {
            do {
              iVar8 = (uint)bVar12 + iVar8 * 10 + -0x30;
              if ((iVar21 + 0x7ffffff7) / 10 < iVar8) {
                do {
                  pbVar20 = pbVar10 + 1;
                  pbVar10 = pbVar10 + 1;
                } while ((byte)(*pbVar20 - 0x30) < 10);
              }
              else {
                pbVar10 = pbVar10 + 1;
              }
              bVar12 = *pbVar10;
            } while ((byte)(bVar12 - 0x30) < 10);
          }
        }
        else {
          do {
            bVar12 = *pbVar10;
            bVar16 = bVar12 - 0x30;
            if (9 < bVar16) goto LAB_001100fd;
            pbVar10 = pbVar10 + 1;
            iVar8 = (uint)bVar12 + iVar8 * 10 + -0x30;
          } while (iVar8 <= 0x134 - iVar21);
          ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ();
LAB_001100fd:
          if (bVar16 < 10) {
            bVar23 = false;
            goto LAB_00110123;
          }
        }
        iVar6 = -iVar8;
        if (!bVar23) {
          iVar6 = iVar8;
        }
        iVar8 = iVar6;
        bVar23 = true;
      }
      else {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
        bVar23 = false;
        iVar8 = 0;
      }
LAB_00110123:
      if (!bVar23) goto LAB_00110343;
    }
    else {
      bVar12 = *pbVar10;
      pbVar10 = pbVar10 + (bVar12 == 0x45);
      iVar8 = 0;
      if (bVar12 == 0x45) goto LAB_0010ffb7;
    }
    if (bVar5) {
      uVar18 = iVar8 + iVar21;
      if ((int)uVar18 < -0x134) {
        dVar28 = 0.0;
        if (-0x269 < (int)uVar18) {
          uVar18 = -uVar18 - 0x134;
          if (0x134 < uVar18) goto LAB_00110424;
          dVar27 = dVar27 / 1e+308;
LAB_001102b4:
          dVar28 = dVar27 / *(double *)(internal::Pow10(int)::e + (ulong)uVar18 * 8);
        }
      }
      else {
        if ((int)uVar18 < 0) {
          uVar18 = -uVar18;
          if (0x134 < uVar18) goto LAB_00110424;
          goto LAB_001102b4;
        }
        if (0x134 < uVar18) {
LAB_00110424:
          __assert_fail("n >= 0 && n <= 308",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/pow10.h"
                        ,0x30,"double rapidjson::internal::Pow10(int)");
        }
        dVar28 = dVar27 * *(double *)(internal::Pow10(int)::e + (ulong)uVar18 * 8);
      }
      if (dVar28 <= 1.79769313486232e+308) {
        pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        if (cVar1 == '-') {
          dVar28 = -dVar28;
        }
        (pGVar9->data_).n = (Number)0x0;
        (pGVar9->data_).s.str = (Ch *)0x0;
        *(double *)&pGVar9->data_ = dVar28;
        (pGVar9->data_).f.flags = 0x216;
        bVar7 = true;
        bVar5 = false;
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x6bb,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = lVar17;
        bVar5 = true;
        bVar7 = true;
      }
    }
    else {
      if (bVar7) {
        if (cVar1 != '-') {
          pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                   Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                             (&handler->stack_,1);
          (pGVar9->data_).n = (Number)0x0;
          (pGVar9->data_).s.str = (Ch *)0x0;
          *(ulong *)&pGVar9->data_ = uVar15;
          uVar13 = (ushort)((uVar15 & 0xffffffff80000000) == 0) * 0x20 +
                   ((ushort)(uVar15 >> 0x20 == 0) << 6 | (ushort)(-1 < (long)uVar15) << 7) + 0x116;
LAB_00110292:
          (pGVar9->data_).f.flags = uVar13;
          goto LAB_00110296;
        }
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-uVar15);
      }
      else {
        if (cVar1 != '-') {
          pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                   Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                             (&handler->stack_,1);
          (pGVar9->data_).n = (Number)0x0;
          (pGVar9->data_).s.str = (Ch *)0x0;
          *(ulong *)&pGVar9->data_ = (ulong)uVar22;
          uVar13 = (ushort)(-1 < (int)uVar22) << 5 | 0x1d6;
          goto LAB_00110292;
        }
        pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        uVar13 = 0xb6;
        if ((int)uVar22 < 1) {
          uVar13 = 0x1f6;
        }
        (pGVar9->data_).n = (Number)0x0;
        (pGVar9->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar9->data_ = (long)(int)-uVar22;
        (pGVar9->data_).f.flags = uVar13;
LAB_00110296:
        bVar7 = true;
      }
      bVar5 = false;
    }
    if ((bVar5) || (bVar7 != false)) goto LAB_00110343;
    ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this);
  }
LAB_001103fc:
  *(long *)(this + 0x38) = lVar17;
LAB_00110343:
  is->src_ = (Ch *)pbVar10;
  is->head_ = pCVar3;
  return;
}

Assistant:

Ch Peek() const { return *src_; }